

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall clipp::parser::clean_miss_candidates_for(parser *this,dfs_traverser *match)

{
  bool bVar1;
  iterator_type __x;
  __normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_40 [24];
  reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
  i;
  dfs_traverser *match_local;
  parser *this_local;
  
  i.current._M_current =
       (__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
        )(__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
          )match;
  std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::rbegin
            ((vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
              *)&stack0xffffffffffffffd8);
  std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::rend
            ((vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
              *)(local_40 + 0x10));
  local_40._8_8_ = i.current._M_current;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate*,std::vector<clipp::parser::miss_candidate,std::allocator<clipp::parser::miss_candidate>>>>,clipp::parser::clean_miss_candidates_for(clipp::group::depth_first_traverser_const&)::_lambda(clipp::parser::miss_candidate_const&)_1_>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
              *)&stack0xffffffffffffffe0,
             (reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
              *)&stack0xffffffffffffffd8,(dfs_traverser *)(local_40 + 0x10));
  std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::rend
            ((vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
              *)local_40);
  bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
                           *)&stack0xffffffffffffffe0,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
                           *)local_40);
  if (bVar1) {
    __x = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
          ::base((reverse_iterator<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>_>
                  *)&stack0xffffffffffffffe0);
    local_50 = std::
               prev<__gnu_cxx::__normal_iterator<clipp::parser::miss_candidate*,std::vector<clipp::parser::miss_candidate,std::allocator<clipp::parser::miss_candidate>>>>
                         (__x._M_current,1);
    __gnu_cxx::
    __normal_iterator<clipp::parser::miss_candidate_const*,std::vector<clipp::parser::miss_candidate,std::allocator<clipp::parser::miss_candidate>>>
    ::__normal_iterator<clipp::parser::miss_candidate*>
              ((__normal_iterator<clipp::parser::miss_candidate_const*,std::vector<clipp::parser::miss_candidate,std::allocator<clipp::parser::miss_candidate>>>
                *)&local_48,&local_50);
    std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
    erase(&this->missCand_,local_48);
  }
  return;
}

Assistant:

void clean_miss_candidates_for(const dfs_traverser& match)
    {
        auto i = std::find_if(missCand_.rbegin(), missCand_.rend(),
            [&](const miss_candidate& m) {
                return &(*m.pos) == &(*match);
            });

        if(i != missCand_.rend()) {
            missCand_.erase(prev(i.base()));
        }
    }